

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O3

int cuddZddSymmSiftingConv(DdManager *table,int lower,int upper)

{
  uint uVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  size_t sVar7;
  int *piVar8;
  void *__base;
  DdNode *pDVar9;
  DdNode *pDVar10;
  DdSubtable *pDVar11;
  DdNode *pDVar12;
  uint uVar13;
  uint *puVar14;
  uint uVar15;
  uint initial_size;
  size_t sVar16;
  ulong uVar17;
  uint uVar18;
  DdHalfWord x;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  uint x_00;
  DdNode *pDVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  uVar6 = table->keysZ;
  uVar1 = table->sizeZ;
  sVar7 = (size_t)(int)uVar1;
  piVar8 = (int *)malloc(sVar7 * 4);
  zdd_entry = piVar8;
  if (piVar8 == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    iVar21 = 0;
  }
  else {
    __base = malloc(sVar7 * 4);
    if (__base == (void *)0x0) {
      table->errorCode = CUDD_MEMORY_OUT;
LAB_00800fce:
      if (zdd_entry != (int *)0x0) {
        free(zdd_entry);
        zdd_entry = (int *)0x0;
      }
      iVar21 = 0;
      if (__base != (void *)0x0) {
        free(__base);
      }
    }
    else {
      if (0 < (int)uVar1) {
        pDVar11 = table->subtableZ;
        piVar2 = table->permZ;
        sVar16 = 0;
        do {
          piVar8[sVar16] = pDVar11[piVar2[sVar16]].keys;
          *(int *)((long)__base + sVar16 * 4) = (int)sVar16;
          sVar16 = sVar16 + 1;
        } while (sVar7 != sVar16);
      }
      qsort(__base,sVar7,4,cuddZddUniqueCompare);
      auVar4 = _DAT_008403e0;
      auVar3 = _DAT_008403d0;
      uVar13 = upper - lower;
      if (lower <= upper) {
        auVar24._4_4_ = 0;
        auVar24._0_4_ = uVar13;
        auVar24._8_4_ = uVar13;
        auVar24._12_4_ = 0;
        puVar14 = &table->subtableZ[(long)lower + 1].next;
        uVar17 = 0;
        auVar24 = auVar24 ^ _DAT_008403e0;
        iVar21 = lower;
        do {
          auVar25._8_4_ = (int)uVar17;
          auVar25._0_8_ = uVar17;
          auVar25._12_4_ = (int)(uVar17 >> 0x20);
          auVar25 = (auVar25 | auVar3) ^ auVar4;
          if ((bool)(~(auVar25._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar25._0_4_ ||
                      auVar24._4_4_ < auVar25._4_4_) & 1)) {
            puVar14[-0xe] = iVar21;
          }
          if ((auVar25._12_4_ != auVar24._12_4_ || auVar25._8_4_ <= auVar24._8_4_) &&
              auVar25._12_4_ <= auVar24._12_4_) {
            *puVar14 = iVar21 + 1;
          }
          uVar17 = uVar17 + 2;
          iVar21 = iVar21 + 2;
          puVar14 = puVar14 + 0x1c;
        } while (((ulong)uVar13 + 2 & 0xfffffffffffffffe) != uVar17);
      }
      uVar13 = table->siftMaxVar;
      if (table->sizeZ < table->siftMaxVar) {
        uVar13 = table->sizeZ;
      }
      if (0 < (int)uVar13) {
        uVar17 = 0;
        iVar21 = zddTotalNumberSwapping;
        do {
          if (table->siftMaxSwap <= iVar21) break;
          uVar15 = table->permZ[*(int *)((long)__base + uVar17 * 4)];
          if ((((int)uVar15 <= upper && lower <= (int)uVar15) &&
              (table->subtableZ[(int)uVar15].next == uVar15)) &&
             (iVar5 = cuddZddSymmSiftingAux(table,uVar15,lower,upper),
             iVar21 = zddTotalNumberSwapping, iVar5 == 0)) goto LAB_00800fce;
          uVar17 = uVar17 + 1;
        } while (uVar13 != uVar17);
      }
      uVar13 = table->keysZ;
      if (table->keysZ < uVar6) {
        do {
          piVar8 = zdd_entry;
          if (upper < lower) {
            sVar7 = 0;
          }
          else {
            pDVar11 = table->subtableZ;
            piVar2 = table->invpermZ;
            uVar17 = 0;
            uVar6 = lower;
            do {
              do {
                uVar15 = uVar6;
                uVar6 = pDVar11[(int)uVar15].next;
              } while (uVar15 < uVar6);
              iVar21 = piVar2[(int)uVar15];
              piVar8[iVar21] = pDVar11[(int)uVar15].keys;
              *(int *)((long)__base + uVar17 * 4) = iVar21;
              uVar17 = uVar17 + 1;
              uVar6 = uVar15 + 1;
            } while ((int)uVar15 < upper);
            sVar7 = uVar17 & 0xffffffff;
          }
          qsort(__base,sVar7,4,cuddZddUniqueCompare);
          uVar6 = table->siftMaxVar;
          if ((int)uVar1 < table->siftMaxVar) {
            uVar6 = uVar1;
          }
          if (0 < (int)uVar6) {
            uVar17 = 0;
            while( true ) {
              if (table->siftMaxSwap <= zddTotalNumberSwapping) goto LAB_00800f2f;
              pDVar11 = table->subtableZ;
              uVar15 = table->permZ[*(int *)((long)__base + uVar17 * 4)];
              uVar19 = (ulong)(int)uVar15;
              uVar20 = pDVar11[uVar19].next;
              if (uVar20 <= uVar15) break;
LAB_00800f23:
              uVar17 = uVar17 + 1;
              if (uVar17 == uVar6) goto LAB_00800f2f;
            }
            initial_size = table->keysZ;
            if (uVar15 == lower) {
              pDVar9 = (DdNode *)cuddZddSymmSifting_down(table,lower,upper,initial_size);
              if (pDVar9 == (DdNode *)0x0) {
                pDVar11 = table->subtableZ;
                uVar19 = (ulong)(uint)lower;
                do {
                  uVar15 = (uint)uVar19;
                  uVar19 = (ulong)pDVar11[(int)uVar15].next;
                } while (uVar15 < pDVar11[(int)uVar15].next);
LAB_00800c19:
                iVar21 = (int)uVar19;
                do {
                  uVar15 = (uint)uVar19;
                  uVar19 = (ulong)pDVar11[(int)uVar15].next;
                } while (uVar15 < pDVar11[(int)uVar15].next);
                if (lower - uVar20 != uVar15 - iVar21) {
LAB_00800e8e:
                  initial_size = table->keysZ;
                  pDVar12 = (DdNode *)cuddZddSymmSifting_up(table,iVar21,lower,initial_size);
                  pDVar10 = pDVar12;
LAB_00800eac:
                  iVar21 = cuddZddSymmSiftingBackward(table,(Move *)pDVar12,initial_size);
                  goto LAB_00800eb1;
                }
              }
              else {
                if (pDVar9 == (DdNode *)0x1) goto LAB_00800fce;
                pDVar11 = table->subtableZ;
                uVar19 = (ulong)pDVar9->ref;
                if (pDVar11[uVar19].next != pDVar9->ref) goto LAB_00800c19;
              }
              iVar21 = cuddZddSymmSiftingBackward(table,(Move *)pDVar9,initial_size);
              pDVar10 = (DdNode *)0x0;
LAB_00800eb1:
              if (iVar21 != 0) {
                if (pDVar9 != (DdNode *)0x0) {
                  pDVar12 = table->nextFree;
                  do {
                    pDVar22 = pDVar9;
                    pDVar9 = (pDVar22->type).kids.T;
                    pDVar22->ref = 0;
                    pDVar22->next = pDVar12;
                    pDVar12 = pDVar22;
                  } while (pDVar9 != (DdNode *)0x0);
                  table->nextFree = pDVar22;
                }
                if (pDVar10 != (DdNode *)0x0) {
                  pDVar9 = table->nextFree;
                  do {
                    pDVar12 = pDVar10;
                    pDVar10 = (pDVar12->type).kids.T;
                    pDVar12->ref = 0;
                    pDVar12->next = pDVar9;
                    pDVar9 = pDVar12;
                  } while (pDVar10 != (DdNode *)0x0);
                  table->nextFree = pDVar12;
                }
                goto LAB_00800f23;
              }
            }
            else {
              uVar18 = upper;
              if (upper == uVar15) {
                do {
                  uVar15 = pDVar11[(int)uVar18].next;
                  bVar23 = uVar18 < uVar15;
                  uVar18 = uVar15;
                  uVar20 = uVar15;
                } while (bVar23);
                do {
                  uVar18 = uVar20;
                  uVar20 = pDVar11[(int)uVar18].next;
                } while (uVar18 < pDVar11[(int)uVar18].next);
                pDVar10 = (DdNode *)cuddZddSymmSifting_up(table,uVar15,lower,initial_size);
                if (pDVar10 == (DdNode *)0x0) {
                  uVar20 = uVar15;
                  do {
                    x_00 = uVar20;
                    uVar20 = table->subtableZ[(int)x_00].next;
                  } while (x_00 < uVar20);
LAB_00800cb1:
                  if (uVar18 - uVar15 != x_00 - uVar20) goto LAB_00800e48;
                }
                else {
                  if (pDVar10 == (DdNode *)0x1) goto LAB_00800fce;
                  x_00 = pDVar10->index;
                  if (table->subtableZ[x_00].next != x_00) {
                    uVar20 = table->subtableZ[(int)x_00].next;
                    goto LAB_00800cb1;
                  }
                }
                iVar21 = cuddZddSymmSiftingBackward(table,(Move *)pDVar10,initial_size);
                pDVar9 = (DdNode *)0x0;
                goto LAB_00800eb1;
              }
              if ((int)(uVar15 - lower) <= (int)(upper - uVar15)) {
                pDVar10 = (DdNode *)cuddZddSymmSifting_up(table,uVar20,lower,initial_size);
                if (pDVar10 == (DdNode *)0x0) {
                  do {
                    x = uVar20;
                    uVar20 = table->subtableZ[(int)x].next;
                  } while (x < uVar20);
                }
                else {
                  if (pDVar10 == (DdNode *)0x1) goto LAB_00800fce;
                  x = pDVar10->index;
                  uVar20 = table->subtableZ[(int)x].next;
                }
                pDVar12 = (DdNode *)cuddZddSymmSifting_down(table,x,upper,initial_size);
                pDVar9 = pDVar12;
                if (pDVar12 == (DdNode *)0x0) {
                  pDVar11 = table->subtableZ;
                  uVar19 = (ulong)x;
                  do {
                    uVar15 = (uint)uVar19;
                    uVar19 = (ulong)pDVar11[(int)uVar15].next;
                  } while (uVar15 < pDVar11[(int)uVar15].next);
LAB_00800df2:
                  iVar21 = (int)uVar19;
                  do {
                    uVar15 = (uint)uVar19;
                    uVar19 = (ulong)pDVar11[(int)uVar15].next;
                  } while (uVar15 < pDVar11[(int)uVar15].next);
                  if (x - uVar20 == uVar15 - iVar21) goto LAB_00800eac;
                  if (pDVar10 != (DdNode *)0x0) {
                    pDVar12 = table->nextFree;
                    do {
                      pDVar22 = pDVar10;
                      pDVar10 = (pDVar22->type).kids.T;
                      pDVar22->ref = 0;
                      pDVar22->next = pDVar12;
                      pDVar12 = pDVar22;
                    } while (pDVar10 != (DdNode *)0x0);
                    table->nextFree = pDVar22;
                  }
                  goto LAB_00800e8e;
                }
                if (pDVar12 != (DdNode *)0x1) {
                  pDVar11 = table->subtableZ;
                  uVar19 = (ulong)pDVar12->ref;
                  if (pDVar11[uVar19].next != pDVar12->ref) goto LAB_00800df2;
                  goto LAB_00800eac;
                }
                goto LAB_00801045;
              }
              pDVar9 = (DdNode *)cuddZddSymmSifting_down(table,uVar15,upper,initial_size);
              if (pDVar9 == (DdNode *)0x0) {
                pDVar11 = table->subtableZ;
                do {
                  uVar18 = (uint)uVar19;
                  uVar15 = pDVar11[(int)uVar18].next;
                  uVar19 = (ulong)uVar15;
                  uVar20 = uVar15;
                } while (uVar18 < uVar15);
              }
              else {
                if (pDVar9 == (DdNode *)0x1) goto LAB_00800fce;
                uVar15 = pDVar9->ref;
                pDVar11 = table->subtableZ;
                uVar20 = uVar15;
              }
              do {
                uVar18 = uVar20;
                uVar20 = pDVar11[(int)uVar18].next;
              } while (uVar18 < pDVar11[(int)uVar18].next);
              pDVar12 = (DdNode *)cuddZddSymmSifting_up(table,uVar15,lower,initial_size);
              pDVar10 = pDVar12;
              if (pDVar12 == (DdNode *)0x0) {
                uVar20 = uVar15;
                do {
                  x_00 = uVar20;
                  uVar20 = table->subtableZ[(int)x_00].next;
                } while (x_00 < uVar20);
LAB_00800dc6:
                if (uVar18 - uVar15 == x_00 - uVar20) goto LAB_00800eac;
                if (pDVar9 != (DdNode *)0x0) {
                  pDVar12 = table->nextFree;
                  do {
                    pDVar22 = pDVar9;
                    pDVar9 = (pDVar22->type).kids.T;
                    pDVar22->ref = 0;
                    pDVar22->next = pDVar12;
                    pDVar12 = pDVar22;
                  } while (pDVar9 != (DdNode *)0x0);
                  table->nextFree = pDVar22;
                }
LAB_00800e48:
                initial_size = table->keysZ;
                pDVar12 = (DdNode *)cuddZddSymmSifting_down(table,x_00,upper,initial_size);
                pDVar9 = pDVar12;
                goto LAB_00800eac;
              }
              if (pDVar12 != (DdNode *)0x1) {
                x_00 = pDVar12->index;
                if (table->subtableZ[x_00].next == x_00) goto LAB_00800eac;
                uVar20 = table->subtableZ[(int)x_00].next;
                goto LAB_00800dc6;
              }
              pDVar10 = (DdNode *)0x1;
            }
            if ((DdNode *)0x1 < pDVar9) {
              pDVar12 = table->nextFree;
              do {
                pDVar22 = pDVar9;
                pDVar9 = (pDVar22->type).kids.T;
                pDVar22->ref = 0;
                pDVar22->next = pDVar12;
                pDVar12 = pDVar22;
              } while (pDVar9 != (DdNode *)0x0);
              table->nextFree = pDVar22;
            }
LAB_00801045:
            if ((DdNode *)0x1 < pDVar10) {
              pDVar9 = table->nextFree;
              do {
                pDVar12 = pDVar10;
                pDVar10 = (pDVar12->type).kids.T;
                pDVar12->ref = 0;
                pDVar12->next = pDVar9;
                pDVar9 = pDVar12;
              } while (pDVar10 != (DdNode *)0x0);
              table->nextFree = pDVar12;
            }
            goto LAB_00800fce;
          }
LAB_00800f2f:
          bVar23 = table->keysZ < uVar13;
          uVar13 = table->keysZ;
        } while (bVar23);
      }
      iVar21 = 1;
      if (lower <= upper) {
        iVar21 = 0;
        do {
          uVar6 = table->subtableZ[lower].next;
          uVar13 = lower;
          uVar1 = lower;
          while (uVar15 = uVar13, uVar6 != lower) {
            iVar21 = iVar21 + 1;
            uVar6 = table->subtableZ[(int)uVar15].next;
            uVar13 = uVar6;
            uVar1 = uVar15;
          }
          lower = uVar1 + 1;
        } while ((int)uVar1 < upper);
        iVar21 = iVar21 + 1;
      }
      free(__base);
      if (zdd_entry != (int *)0x0) {
        free(zdd_entry);
        zdd_entry = (int *)0x0;
      }
    }
  }
  return iVar21;
}

Assistant:

int
cuddZddSymmSiftingConv(
  DdManager * table,
  int  lower,
  int  upper)
{
    int         i;
    int         *var;
    int         nvars;
    int         initialSize;
    int         x;
    int         result;
    int         symvars;
    int         symgroups;
    int         classes;
    int         iteration;
#ifdef DD_STATS
    int         previousSize;
#endif

    initialSize = table->keysZ;

    nvars = table->sizeZ;

    /* Find order in which to sift variables. */
    var = NULL;
    zdd_entry = ABC_ALLOC(int, nvars);
    if (zdd_entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSymmSiftingConvOutOfMem;
    }
    var = ABC_ALLOC(int, nvars);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSymmSiftingConvOutOfMem;
    }

    for (i = 0; i < nvars; i++) {
        x = table->permZ[i];
        zdd_entry[i] = table->subtableZ[x].keys;
        var[i] = i;
    }

    qsort((void *)var, nvars, sizeof(int), (DD_QSFP)cuddZddUniqueCompare);

    /* Initialize the symmetry of each subtable to itself
    ** for first pass of converging symmetric sifting.
    */
    for (i = lower; i <= upper; i++)
        table->subtableZ[i].next = i;

    iteration = ddMin(table->siftMaxVar, table->sizeZ);
    for (i = 0; i < iteration; i++) {
        if (zddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        x = table->permZ[var[i]];
        if (x < lower || x > upper) continue;
        /* Only sift if not in symmetry group already. */
        if (table->subtableZ[x].next == (unsigned) x) {
#ifdef DD_STATS
            previousSize = table->keysZ;
#endif
            result = cuddZddSymmSiftingAux(table, x, lower, upper);
            if (!result)
                goto cuddZddSymmSiftingConvOutOfMem;
#ifdef DD_STATS
            if (table->keysZ < (unsigned) previousSize) {
                (void) fprintf(table->out,"-");
            } else if (table->keysZ > (unsigned) previousSize) {
                (void) fprintf(table->out,"+");
#ifdef DD_VERBOSE
                (void) fprintf(table->out,"\nSize increased from %d to %d while sifting variable %d\n", previousSize, table->keysZ, var[i]);
#endif
            } else {
                (void) fprintf(table->out,"=");
            }
            fflush(table->out);
#endif
        }
    }

    /* Sifting now until convergence. */
    while ((unsigned) initialSize > table->keysZ) {
        initialSize = table->keysZ;
#ifdef DD_STATS
        (void) fprintf(table->out,"\n");
#endif
        /* Here we consider only one representative for each symmetry class. */
        for (x = lower, classes = 0; x <= upper; x++, classes++) {
            while ((unsigned) x < table->subtableZ[x].next)
                x = table->subtableZ[x].next;
            /* Here x is the largest index in a group.
            ** Groups consists of adjacent variables.
            ** Hence, the next increment of x will move it to a new group.
            */
            i = table->invpermZ[x];
            zdd_entry[i] = table->subtableZ[x].keys;
            var[classes] = i;
        }

        qsort((void *)var,classes,sizeof(int),(DD_QSFP)cuddZddUniqueCompare);

        /* Now sift. */
        iteration = ddMin(table->siftMaxVar, nvars);
        for (i = 0; i < iteration; i++) {
            if (zddTotalNumberSwapping >= table->siftMaxSwap)
                break;
            x = table->permZ[var[i]];
            if ((unsigned) x >= table->subtableZ[x].next) {
#ifdef DD_STATS
                previousSize = table->keysZ;
#endif
                result = cuddZddSymmSiftingConvAux(table, x, lower, upper);
                if (!result)
                    goto cuddZddSymmSiftingConvOutOfMem;
#ifdef DD_STATS
                if (table->keysZ < (unsigned) previousSize) {
                    (void) fprintf(table->out,"-");
                } else if (table->keysZ > (unsigned) previousSize) {
                    (void) fprintf(table->out,"+");
#ifdef DD_VERBOSE
                (void) fprintf(table->out,"\nSize increased from %d to %d while sifting variable %d\n", previousSize, table->keysZ, var[i]);
#endif
                } else {
                    (void) fprintf(table->out,"=");
                }
                fflush(table->out);
#endif
            }
        } /* for */
    }

    cuddZddSymmSummary(table, lower, upper, &symvars, &symgroups);

#ifdef DD_STATS
    (void) fprintf(table->out,"\n#:S_SIFTING %8d: symmetric variables\n",
                   symvars);
    (void) fprintf(table->out,"#:G_SIFTING %8d: symmetric groups\n",
                   symgroups);
#endif

    ABC_FREE(var);
    ABC_FREE(zdd_entry);

    return(1+symvars);

cuddZddSymmSiftingConvOutOfMem:

    if (zdd_entry != NULL)
        ABC_FREE(zdd_entry);
    if (var != NULL)
        ABC_FREE(var);

    return(0);

}